

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O1

int flvtag_initamf(flvtag_t *tag,uint32_t dts)

{
  uint8_t *puVar1;
  
  tag->data = (uint8_t *)0x0;
  tag->aloc = 0;
  if (tag->aloc < 0x80f) {
    puVar1 = (uint8_t *)realloc(tag->data,0x80f);
    tag->data = puVar1;
    tag->aloc = 0x80f;
  }
  *tag->data = '\x12';
  tag->data[4] = (uint8_t)(dts >> 0x10);
  tag->data[5] = (uint8_t)(dts >> 8);
  tag->data[6] = (uint8_t)dts;
  tag->data[7] = (uint8_t)(dts >> 0x18);
  tag->data[8] = '\0';
  tag->data[9] = '\0';
  tag->data[10] = '\0';
  tag->data[1] = '\0';
  tag->data[2] = '\0';
  tag->data[3] = '\0';
  tag->data[0xb] = '\0';
  tag->data[0xc] = '\0';
  tag->data[0xd] = '\0';
  tag->data[0xe] = '\v';
  return 1;
}

Assistant:

int flvtag_initamf(flvtag_t* tag, uint32_t dts)
{
    flvtag_init(tag);
    flvtag_reserve(tag, FLVTAG_PREALOC);
    tag->data[0] = flvtag_type_scriptdata;
    tag->data[4] = dts >> 16;
    tag->data[5] = dts >> 8;
    tag->data[6] = dts >> 0;
    tag->data[7] = dts >> 24;
    tag->data[8] = 0; // StreamID
    tag->data[9] = 0; // StreamID
    tag->data[10] = 0; // StreamID
    flvtag_updatesize(tag, 0);
    return 1;
}